

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_manager.cc
# Opt level: O1

RC __thiscall
RM_Manager::SetUpFH(RM_Manager *this,RM_FileHandle *fileHandle,PF_FileHandle *fh,
                   RM_FileHeader *header)

{
  int iVar1;
  int iVar2;
  PageNum PVar3;
  bool bVar4;
  RC RVar5;
  
  iVar1 = header->bitmapSize;
  (fileHandle->header).bitmapOffset = header->bitmapOffset;
  (fileHandle->header).bitmapSize = iVar1;
  iVar1 = header->numRecordsPerPage;
  iVar2 = header->numPages;
  PVar3 = header->firstFreePage;
  (fileHandle->header).recordSize = header->recordSize;
  (fileHandle->header).numRecordsPerPage = iVar1;
  (fileHandle->header).numPages = iVar2;
  (fileHandle->header).firstFreePage = PVar3;
  PF_FileHandle::operator=(&fileHandle->pfh,fh);
  fileHandle->header_modified = false;
  fileHandle->openedFH = true;
  bVar4 = RM_FileHandle::isValidFileHeader(fileHandle);
  RVar5 = 0;
  if (!bVar4) {
    fileHandle->openedFH = false;
    RVar5 = 0x6a;
  }
  return RVar5;
}

Assistant:

RC RM_Manager::SetUpFH(RM_FileHandle& fileHandle, PF_FileHandle &fh, struct RM_FileHeader* header){
  // set up the private variables
  memcpy(&fileHandle.header, header, sizeof(struct RM_FileHeader));
  fileHandle.pfh = fh;
  fileHandle.header_modified = false;
  fileHandle.openedFH = true;

  // confirms that the header is valid
  if(! fileHandle.isValidFileHeader()){
    fileHandle.openedFH = false;
    return (RM_INVALIDFILE);
  }
  return (0);
}